

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::ThreadData::thread_procedure
          (ThreadData *this,size_t i_target_put_count,size_t i_target_consume_count,
          uint64_t i_affinity_mask)

{
  reentrant_consume_operation *prVar1;
  reentrant_consume_operation *prVar2;
  reentrant_put_transaction<void> *prVar3;
  reentrant_put_transaction<void> *prVar4;
  result_type_conflict rVar5;
  result_type rVar6;
  char cVar7;
  size_t cycles;
  byte bVar8;
  reentrant_consume_operation *this_00;
  reentrant_put_transaction<void> *this_01;
  ThreadAllocRandomFailures scoped_alloc_failures;
  ThreadAllocRandomFailures local_49;
  EasyRandom *local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  set_thread_affinity(i_affinity_mask);
  local_48 = (EasyRandom *)(this + 0x50);
  ThreadAllocRandomFailures::ThreadAllocRandomFailures(&local_49,local_48,0.03);
  LOCK();
  *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 1;
  UNLOCK();
  cVar7 = '\0';
  bVar8 = 0;
  do {
    if (*(ulong *)(this + 0x13e0) < i_target_put_count) {
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,&local_48->m_rand,&local_40._M_param);
      if (rVar6 < (ulong)((*(long *)(this + 0x13f8) - *(long *)(this + 0x13f0) >> 3) *
                         -0x3333333333333333)) {
        handle_pending_put(this,rVar6);
      }
    }
    else if (i_target_consume_count <= *(ulong *)(this + 0x13e8)) {
      **(ulong **)(this + 0x48) = *(ulong *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      prVar1 = *(reentrant_consume_operation **)(this + 0x1408);
      prVar2 = *(reentrant_consume_operation **)(this + 0x1410);
      this_00 = prVar1;
      if (prVar2 != prVar1) {
        do {
          density::
          lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::reentrant_consume_operation::~reentrant_consume_operation(this_00);
          this_00 = this_00 + 0x20;
        } while (this_00 != prVar2);
        *(reentrant_consume_operation **)(this + 0x1410) = prVar1;
      }
      prVar3 = *(reentrant_put_transaction<void> **)(this + 0x13f0);
      prVar4 = *(reentrant_put_transaction<void> **)(this + 0x13f8);
      this_01 = prVar3;
      if (prVar4 != prVar3) {
        do {
          density::
          lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction(this_01);
          this_01 = this_01 + 0x28;
        } while (this_01 != prVar4);
        *(reentrant_put_transaction<void> **)(this + 0x13f8) = prVar3;
      }
      LOCK();
      *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 0;
      UNLOCK();
      ThreadAllocRandomFailures::~ThreadAllocRandomFailures(&local_49);
      return;
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count) {
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xf;
      rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,&local_48->m_rand,&local_40._M_param);
      if (rVar6 < (ulong)(*(long *)(this + 0x1410) - *(long *)(this + 0x1408) >> 5)) {
        handle_pending_consume(this,rVar6);
      }
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count &&
        (*(ulong *)(this + 0x13e0) < i_target_put_count && (bVar8 & 1) == 0)) {
      local_40._M_param._M_a = 0x100000000;
      rVar5 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_40,&local_48->m_rand,
                         (param_type *)&local_40);
      if (rVar5 == 0) goto LAB_00d0044c;
LAB_00d00442:
      try_consume_one(this);
    }
    else if (*(ulong *)(this + 0x13e0) < i_target_put_count && (bVar8 & 1) == 0) {
LAB_00d0044c:
      put_one(this);
    }
    else {
      if (*(ulong *)(this + 0x13e8) < i_target_consume_count) goto LAB_00d00442;
      sched_yield();
    }
    if (cVar7 == '\0') {
      **(undefined8 **)(this + 0x48) = *(undefined8 *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      bVar8 = **(byte **)(this + 0x1420);
    }
    cVar7 = cVar7 + '\x01';
  } while( true );
}

Assistant:

void thread_procedure(
              size_t const i_target_put_count,
              size_t const i_target_consume_count,
              uint64_t     i_affinity_mask)
            {
                set_thread_affinity(i_affinity_mask);

                ThreadAllocRandomFailures scoped_alloc_failures(m_random, 0.03);

                m_incremental_stats->m_thread_is_active.store(true);

                bool too_many_enqueued = false;

                for (size_t cycles = 0; m_put_committed < i_target_put_count ||
                                        m_consumes_committed < i_target_consume_count;
                     cycles++)
                {
                    // decide between put and consume

                    if (m_put_committed < i_target_put_count)
                    {
                        auto const pending_put_index = m_random.get_int<size_t>(15);
                        if (pending_put_index < m_pending_reentrant_puts.size())
                        {
                            handle_pending_put(pending_put_index);
                        }
                    }

                    if (m_consumes_committed < i_target_consume_count)
                    {
                        auto const pending_consume_index = m_random.get_int<size_t>(15);
                        if (pending_consume_index < m_pending_reentrant_consumes.size())
                        {
                            handle_pending_consume(pending_consume_index);
                        }
                    }

                    bool const can_produce =
                      m_put_committed < i_target_put_count && !too_many_enqueued;
                    bool const can_consume = m_consumes_committed < i_target_consume_count;

                    if (can_produce && can_consume)
                    {
                        if (m_random.get_bool())
                            put_one();
                        else
                            try_consume_one();
                    }
                    else if (can_produce)
                    {
                        put_one();
                    }
                    else if (can_consume)
                    {
                        try_consume_one();
                    }
                    else
                    {
                        std::this_thread::yield();
                    }

                    // update the progress periodically
                    if ((cycles & 255) == 0)
                    {
                        m_incremental_stats->m_produced.store(
                          m_put_committed, std::memory_order_relaxed);
                        m_incremental_stats->m_consumed.store(
                          m_consumes_committed, std::memory_order_relaxed);
                        too_many_enqueued =
                          m_feedback->m_too_many_enqueued.load(std::memory_order_relaxed);
                    }
                }

                m_incremental_stats->m_produced.store(m_put_committed, std::memory_order_relaxed);
                m_incremental_stats->m_consumed.store(
                  m_consumes_committed, std::memory_order_relaxed);

                /* we destroy the pending operation (they get canceled), because otherwise the
                    destructor of the queue would trigger an undefined behavior */
                m_pending_reentrant_consumes.clear();
                m_pending_reentrant_puts.clear();

                // to do: not exception safe
                m_incremental_stats->m_thread_is_active.store(false);
            }